

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     jump_far<InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,Context *context)

{
  Source SVar1;
  uint16_t segment_00;
  ImmediateT address;
  type_conflict3 address_00;
  type_conflict3 segment_01;
  uint32_t uVar2;
  FlowController *this;
  uint16_t segment;
  uint16_t offset;
  DataPointer DStack_1c;
  Source source_segment;
  uint16_t local_1a;
  DataPointer pointer;
  Context *pCStack_18;
  uint16_t source_address;
  Context *context_local;
  Instruction<false> *instruction_local;
  
  local_1a = 0;
  pCStack_18 = context;
  DStack_1c = Instruction<false>::destination(instruction);
  SVar1 = DataPointer::source(&stack0xffffffffffffffe4);
  switch(SVar1) {
  case DirectAddress:
    uVar2 = address<(InstructionSet::x86::Source)15,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (instruction,DStack_1c,pCStack_18);
    local_1a = (uint16_t)uVar2;
    break;
  default:
  case Immediate:
    this = &pCStack_18->flow_controller;
    segment_00 = Instruction<false>::segment(instruction);
    address = Instruction<false>::offset(instruction);
    PCCompatible::FlowController::jump<unsigned_short>(this,segment_00,address);
    return;
  case IndirectNoBase:
    uVar2 = address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (instruction,DStack_1c,pCStack_18);
    local_1a = (uint16_t)uVar2;
    break;
  case Indirect:
    uVar2 = address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (instruction,DStack_1c,pCStack_18);
    local_1a = (uint16_t)uVar2;
  }
  SVar1 = Instruction<false>::data_segment(instruction);
  PCCompatible::Memory::preauthorise_read(&pCStack_18->memory,SVar1,local_1a,4);
  address_00 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                         (&pCStack_18->memory,SVar1,local_1a);
  local_1a = local_1a + 2;
  segment_01 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                         (&pCStack_18->memory,SVar1,local_1a);
  PCCompatible::FlowController::jump<unsigned_short>
            (&pCStack_18->flow_controller,segment_01,address_00);
  return;
}

Assistant:

void jump_far(
	InstructionT &instruction,
	ContextT &context
) {
	// TODO: eliminate 16-bit assumption below.
	uint16_t source_address = 0;
	const auto pointer = instruction.destination();
	switch(pointer.source()) {
		default:
		case Source::Immediate:	context.flow_controller.template jump<uint16_t>(instruction.segment(), instruction.offset());	return;

		case Source::Indirect:
			source_address = uint16_t(address<Source::Indirect, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::IndirectNoBase:
			source_address = uint16_t(address<Source::IndirectNoBase, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::DirectAddress:
			source_address = uint16_t(address<Source::DirectAddress, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
	}

	const Source source_segment = instruction.data_segment();
	context.memory.preauthorise_read(source_segment, source_address, sizeof(uint16_t) * 2);

	const uint16_t offset = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);
	source_address += 2;
	const uint16_t segment = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);
	context.flow_controller.template jump<uint16_t>(segment, offset);
}